

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msaa.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint hint;
  GLFWwindow *handle;
  double dVar2;
  uint local_2c;
  
  hint = 4;
  while( true ) {
    iVar1 = getopt(argc,argv,"hs:");
    if (iVar1 != 0x73) break;
    hint = atoi(optarg);
  }
  if (iVar1 == -1) {
    local_2c = hint;
    glfwSetErrorCallback(error_callback);
    iVar1 = glfwInit();
    if (iVar1 != 0) {
      if (hint == 0) {
        puts("Requesting that MSAA not be available");
      }
      else {
        printf("Requesting MSAA with %i samples\n",(ulong)hint);
      }
      glfwWindowHint(0x2100d,hint);
      glfwWindowHint(0x20004,0);
      handle = glfwCreateWindow(800,400,"Aliasing Detector",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle != (GLFWwindow *)0x0) {
        glfwSetKeyCallback(handle,key_callback);
        glfwSetFramebufferSizeCallback(handle,framebuffer_size_callback);
        glfwMakeContextCurrent(handle);
        glfwSwapInterval(1);
        iVar1 = glfwExtensionSupported("GL_ARB_multisample");
        if (iVar1 != 0) {
          glfwShowWindow(handle);
          glGetIntegerv(0x80a9,&local_2c);
          if (local_2c == 0) {
            puts("Context reports MSAA is unavailable");
          }
          else {
            printf("Context reports MSAA is available with %i samples\n");
          }
          glMatrixMode(0x1701);
          glOrtho(0,0x3ff0000000000000,0,0x3fe0000000000000,0,0);
          glMatrixMode(0x1700);
          while( true ) {
            iVar1 = glfwWindowShouldClose(handle);
            if (iVar1 != 0) break;
            dVar2 = glfwGetTime();
            glClear(0x4000);
            glLoadIdentity();
            glTranslatef(0x3e800000,0x3e800000,0);
            glRotatef((float)dVar2,0,0,0x3f800000);
            glDisable(0x809d);
            glRectf(0xbe19999a,0xbe19999a,0x3e19999a,0x3e19999a);
            glLoadIdentity();
            glTranslatef(0x3f400000,0x3e800000,0);
            glRotatef((float)dVar2,0,0,0x3f800000);
            glEnable(0x809d);
            glRectf(0xbe19999a,0xbe19999a,0x3e19999a,0x3e19999a);
            glfwSwapBuffers(handle);
            glfwPollEvents();
          }
          glfwTerminate();
          goto LAB_00106cce;
        }
        puts("GL_ARB_multisample extension not supported");
      }
      glfwTerminate();
    }
  }
  else {
    if (iVar1 == 0x68) {
      usage();
LAB_00106cce:
      exit(0);
    }
    usage();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch, samples = 4;
    GLFWwindow* window;

    while ((ch = getopt(argc, argv, "hs:")) != -1)
    {
        switch (ch)
        {
            case 'h':
                usage();
                exit(EXIT_SUCCESS);
            case 's':
                samples = atoi(optarg);
                break;
            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (samples)
        printf("Requesting MSAA with %i samples\n", samples);
    else
        printf("Requesting that MSAA not be available\n");

    glfwWindowHint(GLFW_SAMPLES, samples);
    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    window = glfwCreateWindow(800, 400, "Aliasing Detector", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);
    glfwSetFramebufferSizeCallback(window, framebuffer_size_callback);

    glfwMakeContextCurrent(window);
    glfwSwapInterval(1);

    if (!glfwExtensionSupported("GL_ARB_multisample"))
    {
        printf("GL_ARB_multisample extension not supported\n");

        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwShowWindow(window);

    glGetIntegerv(GL_SAMPLES_ARB, &samples);
    if (samples)
        printf("Context reports MSAA is available with %i samples\n", samples);
    else
        printf("Context reports MSAA is unavailable\n");

    glMatrixMode(GL_PROJECTION);
    glOrtho(0.f, 1.f, 0.f, 0.5f, 0.f, 1.f);
    glMatrixMode(GL_MODELVIEW);

    while (!glfwWindowShouldClose(window))
    {
        GLfloat time = (GLfloat) glfwGetTime();

        glClear(GL_COLOR_BUFFER_BIT);

        glLoadIdentity();
        glTranslatef(0.25f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glDisable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glLoadIdentity();
        glTranslatef(0.75f, 0.25f, 0.f);
        glRotatef(time, 0.f, 0.f, 1.f);

        glEnable(GL_MULTISAMPLE_ARB);
        glRectf(-0.15f, -0.15f, 0.15f, 0.15f);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}